

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

__pid_t __thiscall sznet::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  MutexLock *mutex;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  CountDownLatch *this_local;
  
  mutex = &this->m_mutex;
  lock.m_mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,mutex);
  while (0 < this->m_count) {
    Condition::wait(&this->m_condition,mutex);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return extraout_EAX;
}

Assistant:

void CountDownLatch::wait()
{
	MutexLockGuard lock(m_mutex);
	while (m_count > 0)
	{
		m_condition.wait();
	}
}